

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveWriter.cpp
# Opt level: O1

EStatusCode __thiscall CFFPrimitiveWriter::Pad5Bytes(CFFPrimitiveWriter *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->mInternalState != eFailure) {
    iVar1 = (*this->mCFFOutput->_vptr_IByteWriter[2])(this->mCFFOutput,BytesPad5,5);
    if (CONCAT44(extraout_var,iVar1) != 5) {
      this->mInternalState = eFailure;
    }
    return -(uint)(CONCAT44(extraout_var,iVar1) != 5);
  }
  return eFailure;
}

Assistant:

EStatusCode CFFPrimitiveWriter::Write(const Byte* inBuffer,LongBufferSizeType inBufferSize)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;
    
	EStatusCode status = (mCFFOutput->Write(inBuffer,inBufferSize) == inBufferSize ? PDFHummus::eSuccess : PDFHummus::eFailure);
    
	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;
}